

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testInit
          (VaryingExceedingComponentsTest *this)

{
  Type TVar1;
  undefined1 local_b0 [8];
  testCase test_case_out_one;
  testCase test_case_out_arr;
  testCase test_case_in_one;
  testCase test_case_in_arr;
  GLuint stage;
  GLuint invalid_component;
  GLuint valid_component;
  GLuint n_req_components;
  GLuint local_38;
  undefined8 local_2c;
  GLuint local_24;
  undefined8 *local_20;
  Type *type;
  GLuint i;
  GLuint n_types;
  VaryingExceedingComponentsTest *this_local;
  
  _i = this;
  type._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type._0_4_ = 0; (uint)type < type._4_4_; type._0_4_ = (uint)type + 1) {
    TVar1 = TestBase::getType((TestBase *)this,(uint)type);
    _valid_component = TVar1._0_8_;
    local_2c = _valid_component;
    local_38 = TVar1.m_n_rows;
    local_24 = local_38;
    local_20 = &local_2c;
    local_38 = 5 - local_38;
    for (test_case_in_arr.m_type.m_n_columns = 0; test_case_in_arr.m_type.m_n_columns < 6;
        test_case_in_arr.m_type.m_n_columns = test_case_in_arr.m_type.m_n_columns + 1) {
      if ((test_case_in_arr.m_type.m_n_columns != 0) && (*(int *)((long)local_20 + 4) == 1)) {
        test_case_in_one.m_type.m_n_rows._0_1_ = 1;
        test_case_in_one.m_type.m_n_rows._1_1_ = 1;
        test_case_out_arr.m_type.m_n_rows._0_1_ = 1;
        test_case_out_arr.m_type.m_n_rows._1_1_ = 0;
        test_case_in_one.m_component = test_case_in_arr.m_type.m_n_columns;
        test_case_in_one._4_8_ = *local_20;
        test_case_in_one.m_type.m_basic_type = *(TYPES *)(local_20 + 1);
        test_case_out_one.m_type.m_n_rows._0_1_ = 0;
        test_case_out_one.m_type.m_n_rows._1_1_ = 1;
        test_case_out_arr.m_component = test_case_in_arr.m_type.m_n_columns;
        test_case_out_arr._4_8_ = *local_20;
        test_case_out_arr.m_type.m_basic_type = *(TYPES *)(local_20 + 1);
        local_b0[4] = false;
        local_b0[5] = false;
        test_case_out_one.m_component = test_case_in_arr.m_type.m_n_columns;
        test_case_out_one._4_8_ = *local_20;
        test_case_out_one.m_type.m_basic_type = *(TYPES *)(local_20 + 1);
        local_b0._0_4_ = local_38;
        test_case_out_one.m_type.m_n_columns = local_38;
        test_case_out_arr.m_type.m_n_columns = local_38;
        test_case_in_one.m_type.m_n_columns = local_38;
        std::
        vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
        ::push_back(&this->m_test_cases,(value_type *)&test_case_in_one.m_type.m_n_columns);
        std::
        vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
        ::push_back(&this->m_test_cases,(value_type *)&test_case_out_arr.m_type.m_n_columns);
        if (test_case_in_arr.m_type.m_n_columns != 5) {
          std::
          vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_out_one.m_type.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_b0);
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingExceedingComponentsTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type				 = getType(i);
		const GLuint	   n_req_components  = type.m_n_rows;
		const GLuint	   valid_component   = n_components_per_location - n_req_components;
		const GLuint	   invalid_component = valid_component + 1;

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			/* Component cannot be used for matrices */
			if (1 != type.m_n_columns)
			{
				continue;
			}

			testCase test_case_in_arr  = { invalid_component, true, true, (Utils::Shader::STAGES)stage, type };
			testCase test_case_in_one  = { invalid_component, true, false, (Utils::Shader::STAGES)stage, type };
			testCase test_case_out_arr = { invalid_component, false, true, (Utils::Shader::STAGES)stage, type };
			testCase test_case_out_one = { invalid_component, false, false, (Utils::Shader::STAGES)stage, type };

			m_test_cases.push_back(test_case_in_arr);
			m_test_cases.push_back(test_case_in_one);

			if (Utils::Shader::FRAGMENT != stage)
			{
				m_test_cases.push_back(test_case_out_arr);
				m_test_cases.push_back(test_case_out_one);
			}
		}
	}
}